

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StandardRsCaseItemSyntax::StandardRsCaseItemSyntax
          (StandardRsCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          RsProdItemSyntax *item,Token semi)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  RsProdItemSyntax *pRVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  RsProdItemSyntax *in_R8;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  undefined4 in_stack_ffffffffffffff88;
  SyntaxKind in_stack_ffffffffffffff8c;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *this_00;
  RsProdItemSyntax *local_30;
  RsProdItemSyntax *local_28;
  SyntaxNode *local_10;
  SyntaxNode *local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&stack0x00000008;
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  RsCaseItemSyntax::RsCaseItemSyntax((RsCaseItemSyntax *)this_00,in_stack_ffffffffffffff8c);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (this_00,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_RDI[3].parent = local_10;
  in_RDI[3].previewNode = local_8;
  local_30 = local_28;
  not_null<slang::syntax::RsProdItemSyntax_*>::not_null<slang::syntax::RsProdItemSyntax_*>
            ((not_null<slang::syntax::RsProdItemSyntax_*> *)(in_RDI + 4),&local_30);
  in_RDI[4].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[4].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[1].previewNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x270ff0);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::ExpressionSyntax_*> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pEVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                          *)0x27102f);
    (pEVar2->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)this_00);
  }
  pRVar3 = not_null<slang::syntax::RsProdItemSyntax_*>::operator->
                     ((not_null<slang::syntax::RsProdItemSyntax_*> *)0x27105c);
  (pRVar3->super_RsProdSyntax).super_SyntaxNode.parent = in_RDI;
  return;
}

Assistant:

StandardRsCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, RsProdItemSyntax& item, Token semi) :
        RsCaseItemSyntax(SyntaxKind::StandardRsCaseItem), expressions(expressions), colon(colon), item(&item), semi(semi) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->item->parent = this;
    }